

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_decompress1X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  undefined1 *puVar1;
  ushort uVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  bool bVar14;
  
  if ((flags & 1U) != 0) {
    if (cSrcSize == 0) {
      return 0xffffffffffffffb8;
    }
    puVar1 = (undefined1 *)((long)dst + dstSize);
    uVar2 = *(ushort *)((long)DTable + 2);
    if (cSrcSize < 8) {
      uVar11 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar11 = uVar11 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar11 = uVar11 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar11 = uVar11 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar11 = uVar11 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar11 = uVar11 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar11 = uVar11 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      }
      bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar4 == 0) {
        return 0xffffffffffffffec;
      }
      uVar10 = (ulong)(LZCOUNT((uint)bVar4) + (int)cSrcSize * -8 + 0x29);
      puVar13 = (ulong *)cSrc;
      if (3 < (long)dstSize) {
        uVar9 = 0;
        goto LAB_001bbd83;
      }
    }
    else {
      bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar4 == 0) {
        return 0xffffffffffffffff;
      }
      if (0xffffffffffffff88 < cSrcSize) {
        return cSrcSize;
      }
      uVar9 = cSrcSize - 8;
      uVar11 = *(ulong *)((long)cSrc + (cSrcSize - 8));
      uVar6 = (LZCOUNT((uint)bVar4) ^ 0xffffffe0U) + 9;
      uVar10 = (ulong)uVar6;
      puVar13 = (ulong *)((long)cSrc + uVar9);
      if (3 < (long)dstSize) {
LAB_001bbd83:
        uVar6 = -(uint)uVar2 & 0x3f;
        do {
          if ((long)uVar9 < 8) {
            if (uVar9 == 0) goto LAB_001bbe9a;
            uVar5 = (uint)(uVar10 >> 3);
            bVar14 = cSrc <= (void *)((long)puVar13 - (uVar10 >> 3));
            if (!bVar14) {
              uVar5 = (uint)uVar9;
            }
            uVar8 = (uint)uVar10 + uVar5 * -8;
          }
          else {
            uVar5 = (uint)(uVar10 >> 3);
            uVar8 = (uint)uVar10 & 7;
            bVar14 = true;
          }
          uVar10 = (ulong)uVar8;
          uVar9 = uVar9 - uVar5;
          puVar13 = (ulong *)((long)cSrc + uVar9);
          uVar11 = *(ulong *)((long)cSrc + uVar9);
          if ((puVar1 + -3 <= dst) || (!bVar14)) goto LAB_001bbe9a;
          uVar10 = (uVar11 << (uVar10 & 0x3f)) >> uVar6;
          uVar8 = *(byte *)((long)DTable + uVar10 * 2 + 4) + uVar8;
          *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
          uVar10 = (uVar11 << ((ulong)uVar8 & 0x3f)) >> uVar6;
          uVar8 = *(byte *)((long)DTable + uVar10 * 2 + 4) + uVar8;
          *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
          uVar10 = (uVar11 << ((ulong)uVar8 & 0x3f)) >> uVar6;
          uVar8 = *(byte *)((long)DTable + uVar10 * 2 + 4) + uVar8;
          *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
          uVar12 = (uVar11 << ((ulong)uVar8 & 0x3f)) >> uVar6;
          uVar8 = *(byte *)((long)DTable + uVar12 * 2 + 4) + uVar8;
          uVar10 = (ulong)uVar8;
          *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
          dst = (void *)((long)dst + 4);
          if (0x40 < uVar8) goto LAB_001bbe9a;
        } while( true );
      }
      if ((long)cSrcSize < 0x10) {
        if (uVar9 == 0) goto LAB_001bbe9a;
        uVar9 = uVar9 & 0xffffffff;
        if (cSrc <= (void *)((long)puVar13 - (ulong)(uVar6 >> 3))) {
          uVar9 = (ulong)(uVar6 >> 3);
        }
        uVar6 = uVar6 + (int)uVar9 * -8;
      }
      else {
        uVar9 = (ulong)(uVar6 >> 3);
        uVar6 = uVar6 & 7;
      }
      uVar10 = (ulong)uVar6;
      uVar11 = *(ulong *)((long)puVar13 - uVar9);
      puVar13 = (ulong *)((long)puVar13 - uVar9);
    }
LAB_001bbe9a:
    if (dst < puVar1) {
      do {
        uVar9 = (uVar11 << (uVar10 & 0x3f)) >> (-(uint)uVar2 & 0x3f);
        uVar6 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 4) + (int)uVar10;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar9 * 2 + 5);
        dst = (void *)((long)dst + 1);
        uVar10 = (ulong)uVar6;
      } while (dst < puVar1);
    }
    else {
      uVar6 = (uint)uVar10;
    }
    if (uVar6 != 0x40) {
      dstSize = 0xffffffffffffffec;
    }
    if (puVar13 != (ulong *)cSrc) {
      dstSize = 0xffffffffffffffec;
    }
    return dstSize;
  }
  if (cSrcSize == 0) {
    return 0xffffffffffffffb8;
  }
  puVar1 = (undefined1 *)((long)dst + dstSize);
  cVar3 = (char)*(undefined2 *)((long)DTable + 2);
  if (cSrcSize < 8) {
    uVar11 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar11 = uVar11 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar11 = uVar11 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar11 = uVar11 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar11 = uVar11 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar11 = uVar11 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar11 = uVar11 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar4 == 0) {
      return 0xffffffffffffffec;
    }
    uVar6 = 0x1f;
    if (bVar4 != 0) {
      for (; bVar4 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = (uVar6 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
    puVar13 = (ulong *)cSrc;
    if (3 < (long)dstSize) {
      uVar10 = 0;
      goto LAB_00177af4;
    }
  }
  else {
    bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar4 == 0) {
      return 0xffffffffffffffff;
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    uVar10 = cSrcSize - 8;
    puVar13 = (ulong *)((long)cSrc + (cSrcSize - 8));
    uVar11 = *puVar13;
    uVar6 = 0x1f;
    if (bVar4 != 0) {
      for (; bVar4 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = ~uVar6 + 9;
    if (3 < (long)dstSize) {
LAB_00177af4:
      bVar4 = -cVar3 & 0x3f;
      do {
        if ((long)uVar10 < 8) {
          if (uVar10 == 0) goto LAB_00177c17;
          uVar5 = uVar6 >> 3;
          bVar14 = cSrc <= (void *)((long)puVar13 - (ulong)uVar5);
          if (!bVar14) {
            uVar5 = (uint)uVar10;
          }
          uVar6 = uVar6 + uVar5 * -8;
        }
        else {
          uVar5 = uVar6 >> 3;
          uVar6 = uVar6 & 7;
          bVar14 = true;
        }
        uVar10 = uVar10 - uVar5;
        puVar13 = (ulong *)((long)cSrc + uVar10);
        uVar11 = *(ulong *)((long)cSrc + uVar10);
        if ((puVar1 + -3 <= dst) || (!bVar14)) goto LAB_00177c17;
        uVar9 = (uVar11 << ((byte)uVar6 & 0x3f)) >> bVar4;
        iVar7 = *(byte *)((long)DTable + uVar9 * 2 + 4) + uVar6;
        *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar9 * 2 + 5);
        uVar9 = (uVar11 << ((byte)iVar7 & 0x3f)) >> bVar4;
        iVar7 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 4) + iVar7;
        uVar12 = (uVar11 << ((byte)iVar7 & 0x3f)) >> bVar4;
        *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar9 * 2 + 5);
        iVar7 = (uint)*(byte *)((long)DTable + uVar12 * 2 + 4) + iVar7;
        uVar9 = (uVar11 << ((byte)iVar7 & 0x3f)) >> bVar4;
        *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar12 * 2 + 5);
        uVar6 = (uint)*(byte *)((long)DTable + uVar9 * 2 + 4) + iVar7;
        *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar9 * 2 + 5);
        dst = (void *)((long)dst + 4);
        if (0x40 < uVar6) goto LAB_00177c17;
      } while( true );
    }
    if ((long)cSrcSize < 0x10) {
      if (uVar10 == 0) goto LAB_00177c17;
      uVar10 = uVar10 & 0xffffffff;
      if (cSrc <= (void *)((long)puVar13 - (ulong)(uVar6 >> 3))) {
        uVar10 = (ulong)(uVar6 >> 3);
      }
      uVar6 = uVar6 + (int)uVar10 * -8;
    }
    else {
      uVar10 = (ulong)(uVar6 >> 3);
      uVar6 = uVar6 & 7;
    }
    uVar11 = *(ulong *)((long)puVar13 - uVar10);
    puVar13 = (ulong *)((long)puVar13 - uVar10);
  }
LAB_00177c17:
  if (dst < puVar1) {
    do {
      uVar10 = (uVar11 << ((byte)uVar6 & 0x3f)) >> (-cVar3 & 0x3fU);
      uVar6 = uVar6 + *(byte *)((long)DTable + uVar10 * 2 + 4);
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar10 * 2 + 5);
      dst = (void *)((long)dst + 1);
    } while (dst < puVar1);
  }
  if (uVar6 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (puVar13 != (ulong *)cSrc) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}